

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

void __thiscall MppMetaService::put_meta(MppMetaService *this,MppMetaImpl *meta)

{
  RK_S32 *pRVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  
  if (this->finished == 0) {
    LOCK();
    pRVar1 = &meta->ref_count;
    iVar2 = *pRVar1;
    *pRVar1 = *pRVar1 + -1;
    UNLOCK();
    if (iVar2 + -1 < 1) {
      if (-1 < iVar2 + -1) {
        mpp_spinlock_lock(&this->mLock);
        plVar3 = (meta->list_meta).next;
        plVar4 = (meta->list_meta).prev;
        plVar3->prev = plVar4;
        plVar4->next = plVar3;
        (meta->list_meta).next = &meta->list_meta;
        (meta->list_meta).prev = &meta->list_meta;
        mpp_spinlock_unlock(&this->mLock);
        LOCK();
        this->meta_count = this->meta_count + -1;
        UNLOCK();
        mpp_osal_free("put_meta",meta);
        return;
      }
      _mpp_log_l(2,"mpp_meta","invalid negative ref_count %d\n","put_meta");
      return;
    }
  }
  return;
}

Assistant:

void MppMetaService::put_meta(MppMetaImpl *meta)
{
    if (finished)
        return ;

    RK_S32 ref_count = MPP_SUB_FETCH(&meta->ref_count, 1);

    if (ref_count > 0)
        return;

    if (ref_count < 0) {
        mpp_err_f("invalid negative ref_count %d\n", ref_count);
        return;
    }

    mpp_spinlock_lock(&mLock);
    list_del_init(&meta->list_meta);
    mpp_spinlock_unlock(&mLock);
    MPP_FETCH_SUB(&meta_count, 1);

    mpp_free(meta);
}